

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

void Sfm_LibPrepareAdd(Sfm_Lib_t *p,word *pTruth,int *Perm,int nFanins,Mio_Cell2_t *pCellBot,
                      Mio_Cell2_t *pCellTop,int InTop)

{
  Sfm_Fun_t *pSVar1;
  int *piVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  Sfm_Fun_t *pSVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int nObjsAlloc;
  int iVar11;
  char cVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int Profile [8];
  int InvPerm [8];
  int aiStack_78 [8];
  char acStack_58 [40];
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    iVar16 = 0;
  }
  else {
    iVar16 = (int)pCellTop->AreaW;
  }
  wVar3 = pCellBot->AreaW;
  uVar4 = Vec_MemHashInsert(p->vTtMem,pTruth);
  if (uVar4 == (p->vLists).nSize) {
    Vec_IntPush(&p->vLists,-1);
    Vec_IntPush(&p->vCounts,0);
    Vec_IntPush(&p->vHits,0);
  }
  if (pCellBot == (Mio_Cell2_t *)0x0) {
    __assert_fail("pCellBot != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x15b,
                  "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                 );
  }
  iVar16 = iVar16 + (int)wVar3;
  if (p->fDelay == 0) {
    if (((int)uVar4 < 0) || ((p->vLists).nSize <= (int)uVar4)) goto LAB_004fcb2d;
    iVar11 = (p->vLists).pArray[uVar4];
    while( true ) {
      if ((long)iVar11 == -1) {
        pSVar7 = (Sfm_Fun_t *)0x0;
      }
      else {
        pSVar7 = p->pObjs + iVar11;
      }
      if (pSVar7 == (Sfm_Fun_t *)0x0) break;
      if (pSVar7->Area <= iVar16) {
        return;
      }
      iVar11 = pSVar7->Next;
    }
  }
  else {
    if ((p->vProfs).nSize != p->nObjs) {
      __assert_fail("Vec_IntSize(&p->vProfs) == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x15f,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    uVar9 = (ulong)(uint)nFanins;
    if (0 < nFanins) {
      uVar8 = *(uint *)&pCellBot->field_0x10;
      uVar10 = 0;
      do {
        iVar11 = 1;
        if (Perm[uVar10] < (int)(uVar8 >> 0x1c)) {
          iVar11 = 2 - (uint)(pCellTop == (Mio_Cell2_t *)0x0);
        }
        aiStack_78[uVar10] = iVar11;
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    (p->vTemp).nSize = 0;
    if (((int)uVar4 < 0) || ((p->vLists).nSize <= (int)uVar4)) goto LAB_004fcb2d;
    lVar6 = (long)(p->vLists).pArray[uVar4];
    if (lVar6 == -1) {
      pSVar7 = (Sfm_Fun_t *)0x0;
    }
    else {
      pSVar7 = p->pObjs + lVar6;
    }
    if (pSVar7 != (Sfm_Fun_t *)0x0) {
      do {
        Vec_IntPush(&p->vTemp,(int)((ulong)((long)pSVar7 - (long)p->pObjs) >> 2) * -0x49249249);
        uVar8 = (int)((long)pSVar7 - (long)p->pObjs >> 2) * -0x49249249;
        if (((int)uVar8 < 0) || ((p->vProfs).nSize <= (int)uVar8)) goto LAB_004fcb2d;
        uVar8 = (p->vProfs).pArray[uVar8 & 0x7fffffff];
        if (((int)uVar8 < 0) || ((p->vStore).nSize <= (int)uVar8)) goto LAB_004fcb4c;
        if ((nFanins < 1) || (iVar16 < pSVar7->Area)) {
          if (pSVar7->Area <= iVar16) {
LAB_004fc88d:
            p->nObjSkipped = p->nObjSkipped + 1;
            return;
          }
        }
        else {
          uVar10 = 0;
          while ((p->vStore).pArray[uVar8 + uVar10] <= aiStack_78[uVar10]) {
            uVar10 = uVar10 + 1;
            if (uVar9 == uVar10) goto LAB_004fc88d;
          }
        }
        piVar2 = &pSVar7->Next;
        pSVar7 = p->pObjs + *piVar2;
        if ((long)*piVar2 == -1) {
          pSVar7 = (Sfm_Fun_t *)0x0;
        }
      } while (pSVar7 != (Sfm_Fun_t *)0x0);
    }
    uVar8 = (p->vTemp).nSize;
    uVar10 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar5 = 0;
      lVar6 = 0;
    }
    else {
      piVar2 = (p->vTemp).pArray;
      lVar6 = 0;
      uVar5 = 0;
      do {
        iVar11 = piVar2[lVar6];
        lVar14 = (long)iVar11;
        if ((lVar14 < 0) || ((p->vProfs).nSize <= iVar11)) goto LAB_004fcb2d;
        uVar8 = (p->vProfs).pArray[lVar14];
        if (((int)uVar8 < 0) || ((p->vStore).nSize <= (int)uVar8)) {
LAB_004fcb4c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        iVar13 = p->pObjs[lVar14].Area;
        if ((nFanins < 1) || (iVar13 < iVar16)) {
          if (iVar16 <= iVar13) goto LAB_004fc86f;
LAB_004fc856:
          if (((int)uVar5 < 0) || ((int)uVar10 <= (int)uVar5)) goto LAB_004fcb6b;
          uVar10 = (ulong)uVar5;
          uVar5 = uVar5 + 1;
          piVar2[uVar10] = iVar11;
        }
        else {
          uVar15 = 0;
          do {
            if ((p->vStore).pArray[uVar8 + uVar15] < aiStack_78[uVar15]) goto LAB_004fc856;
            uVar15 = uVar15 + 1;
          } while (uVar9 != uVar15);
LAB_004fc86f:
          p->nObjRemoved = p->nObjRemoved + 1;
        }
        lVar6 = lVar6 + 1;
        uVar8 = (p->vTemp).nSize;
        uVar10 = (ulong)(int)uVar8;
      } while (lVar6 < (long)uVar10);
    }
    if ((int)uVar5 < (int)lVar6) {
      if (uVar5 == 0) {
        if ((p->vLists).nSize <= (int)uVar4) {
LAB_004fcb6b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pSVar7 = (Sfm_Fun_t *)((p->vLists).pArray + uVar4);
      }
      else {
        if ((int)uVar8 < (int)uVar5) {
          __assert_fail("p->nSize >= nSizeNew",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
        }
        (p->vTemp).nSize = uVar5;
        if ((int)uVar5 < 1) goto LAB_004fcb2d;
        if ((p->vLists).nSize <= (int)uVar4) goto LAB_004fcb6b;
        piVar2 = (p->vTemp).pArray;
        iVar11 = *piVar2;
        (p->vLists).pArray[uVar4] = iVar11;
        lVar6 = (long)(p->vTemp).nSize;
        if (1 < lVar6) {
          pSVar7 = p->pObjs;
          lVar14 = 1;
          iVar13 = iVar11;
          do {
            iVar11 = piVar2[lVar14];
            pSVar7[iVar13].Next = iVar11;
            lVar14 = lVar14 + 1;
            iVar13 = iVar11;
          } while (lVar6 != lVar14);
        }
        pSVar7 = p->pObjs + iVar11;
      }
      pSVar7->Next = -1;
    }
  }
  if (0 < nFanins) {
    uVar9 = 0;
    do {
      *(int *)(acStack_58 + (long)Perm[uVar9] * 4) = (int)uVar9;
      uVar9 = uVar9 + 1;
    } while ((uint)nFanins != uVar9);
  }
  if ((p->fDelay != 0) && (Vec_IntPush(&p->vProfs,(p->vStore).nSize), 0 < nFanins)) {
    uVar9 = 0;
    do {
      Vec_IntPush(&p->vStore,aiStack_78[uVar9]);
      uVar9 = uVar9 + 1;
    } while ((uint)nFanins != uVar9);
  }
  iVar11 = p->nObjsAlloc;
  if (p->nObjs == iVar11) {
    if (p->pObjs == (Sfm_Fun_t *)0x0) {
      pSVar7 = (Sfm_Fun_t *)malloc((long)iVar11 * 0x38);
    }
    else {
      pSVar7 = (Sfm_Fun_t *)realloc(p->pObjs,(long)iVar11 * 0x38);
    }
    p->pObjs = pSVar7;
    memset(pSVar7 + p->nObjsAlloc,0,(long)p->nObjsAlloc * 0x1c);
    p->nObjsAlloc = iVar11 * 2;
  }
  pSVar7 = p->pObjs;
  iVar11 = p->nObjs;
  pSVar7[iVar11].Area = iVar16;
  if ((-1 < (int)uVar4) && ((int)uVar4 < (p->vLists).nSize)) {
    pSVar1 = pSVar7 + iVar11;
    piVar2 = (p->vLists).pArray;
    pSVar1->Next = piVar2[uVar4];
    p->nObjs = iVar11 + 1;
    piVar2[uVar4] = iVar11;
    if ((p->vCounts).nSize <= (int)uVar4) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    piVar2 = (p->vCounts).pArray + uVar4;
    *piVar2 = *piVar2 + 1;
    if ((*(uint *)&pCellBot->field_0x10 & 0x3ffff80) != 0) {
      __assert_fail("pCellBot->Id < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x1aa,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    pSVar1->pFansB[0] = (char)*(uint *)&pCellBot->field_0x10;
    uVar9 = 0;
    if (0xfffffff < *(uint *)&pCellBot->field_0x10) {
      uVar9 = 0;
      do {
        pSVar7[iVar11].pFansB[uVar9 + 1] = acStack_58[uVar9 * 4];
        uVar9 = uVar9 + 1;
      } while (uVar9 < *(uint *)&pCellBot->field_0x10 >> 0x1c);
    }
    iVar16 = (int)uVar9;
    if (pCellTop == (Mio_Cell2_t *)0x0) {
      return;
    }
    if ((*(uint *)&pCellTop->field_0x10 & 0x3ffff80) != 0) {
      __assert_fail("pCellTop->Id < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x1b0,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    pSVar1->pFansT[0] = (char)*(uint *)&pCellTop->field_0x10;
    if (0xfffffff < *(uint *)&pCellTop->field_0x10) {
      uVar10 = 0;
      do {
        cVar12 = '\x10';
        if ((uint)InTop != uVar10) {
          iVar16 = (int)uVar9;
          uVar9 = (ulong)(iVar16 + 1);
          cVar12 = acStack_58[(long)iVar16 * 4];
        }
        iVar16 = (int)uVar9;
        pSVar7[iVar11].pFansT[uVar10 + 1] = cVar12;
        uVar10 = uVar10 + 1;
      } while (uVar10 < *(uint *)&pCellTop->field_0x10 >> 0x1c);
    }
    if (iVar16 == nFanins) {
      return;
    }
    __assert_fail("k == nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x1b4,
                  "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                 );
  }
LAB_004fcb2d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sfm_LibPrepareAdd( Sfm_Lib_t * p, word * pTruth, int * Perm, int nFanins, Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    Sfm_Fun_t * pObj;
    int InvPerm[SFM_SUPP_MAX], Profile[SFM_SUPP_MAX];
    int Area = (int)pCellBot->AreaW + (pCellTop ? (int)pCellTop->AreaW : 0);
    int i, k, Id, Prev, Offset, * pProf, iFunc = Vec_MemHashInsert( p->vTtMem, pTruth );
    if ( iFunc == Vec_IntSize(&p->vLists) )
    {
        Vec_IntPush( &p->vLists, -1 );
        Vec_IntPush( &p->vCounts, 0 );
        Vec_IntPush( &p->vHits,   0 );
    }
    assert( pCellBot != NULL );
    // iterate through the supergates of this truth table
    if ( p->fDelay )
    {
        assert( Vec_IntSize(&p->vProfs) == p->nObjs );
        Sfm_LibCellProfile( pCellBot, pCellTop, InTop, nFanins, Perm, Profile );
        // check if new one is contained in old ones
        Vec_IntClear( &p->vTemp );
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            Vec_IntPush( &p->vTemp, Sfm_LibFunId(p, pObj) );
            Offset = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( Sfm_LibNewIsContained(pObj, pProf, Area, Profile, nFanins) )
            {
                p->nObjSkipped++;
                return;
            }
        }
        // check if old ones are contained in new one
        k = 0;
        Vec_IntForEachEntry( &p->vTemp, Id, i )
        {
            Offset = Vec_IntEntry( &p->vProfs, Id );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( !Sfm_LibNewContains(Sfm_LibFun(p, Id), pProf, Area, Profile, nFanins) )
                Vec_IntWriteEntry( &p->vTemp, k++, Id );
            else
                p->nObjRemoved++;
        }
        if ( k < i ) // change
        {
            if ( k == 0 )
                Vec_IntWriteEntry( &p->vLists, iFunc, -1 );
            else
            {
                Vec_IntShrink( &p->vTemp, k );
                Prev = Vec_IntEntry(&p->vTemp, 0);
                Vec_IntWriteEntry( &p->vLists, iFunc, Prev );
                Vec_IntForEachEntryStart( &p->vTemp, Id, i, 1 )
                {
                    Sfm_LibFun(p, Prev)->Next = Id;
                    Prev = Id;
                }
                Sfm_LibFun(p, Prev)->Next = -1;
            }
        }
    }
    else
    {
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            if ( Area >= pObj->Area )
                return;
        }
    }
    for ( k = 0; k < nFanins; k++ )
        InvPerm[Perm[k]] = k;
    // create delay profile
    if ( p->fDelay )
    {
        Vec_IntPush( &p->vProfs, Vec_IntSize(&p->vStore) );
        for ( k = 0; k < nFanins; k++ )
            Vec_IntPush( &p->vStore, Profile[k] );
    }
    // create new object
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjsAlloc = 2 * p->nObjsAlloc;
        p->pObjs = ABC_REALLOC( Sfm_Fun_t, p->pObjs, nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Sfm_Fun_t) * p->nObjsAlloc );
        p->nObjsAlloc = nObjsAlloc;
    }
    pObj = p->pObjs + p->nObjs;
    pObj->Area = Area;
    pObj->Next = Vec_IntEntry(&p->vLists, iFunc);
    Vec_IntWriteEntry( &p->vLists, iFunc, p->nObjs++ );
    Vec_IntAddToEntry( &p->vCounts, iFunc, 1 );
    // create gate
    assert( pCellBot->Id < 128 );
    pObj->pFansB[0] = (char)pCellBot->Id;
    for ( k = 0; k < (int)pCellBot->nFanins; k++ )
        pObj->pFansB[k+1] = InvPerm[k];
    if ( pCellTop == NULL )
        return;
    assert( pCellTop->Id < 128 );
    pObj->pFansT[0] = (char)pCellTop->Id;
    for ( i = 0; i < (int)pCellTop->nFanins; i++ )
        pObj->pFansT[i+1] = (char)(i == InTop ? 16 : InvPerm[k++]);
    assert( k == nFanins );
}